

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O1

char * apprun_shell_expand_variables(char *str,char **argv)

{
  char *pcVar1;
  char *__s;
  size_t sVar2;
  uint uVar3;
  uint new_size;
  char *pcVar4;
  int iVar5;
  char *local_48;
  
  if (str == (char *)0x0) {
    local_48 = (char *)0x0;
  }
  else {
    local_48 = (char *)calloc(1,8);
    if (*str != '\0') {
      uVar3 = 0;
      new_size = 1;
      do {
        iVar5 = 0;
        for (pcVar4 = str; (*pcVar4 != '\0' && (*pcVar4 != '$')); pcVar4 = pcVar4 + 1) {
          iVar5 = iVar5 + -1;
        }
        pcVar1 = apprun_shell_find_var_end(pcVar4);
        if (str < pcVar4) {
          uVar3 = uVar3 - iVar5;
          if (new_size < uVar3) {
            new_size = new_size - iVar5;
            local_48 = apprun_string_extend(local_48,new_size);
          }
          strncat(local_48,str,(ulong)(uint)-iVar5);
        }
        if (pcVar4 != pcVar1) {
          pcVar4 = apprun_shell_extract_var_name(pcVar4);
          __s = apprun_shell_resolve_var_value(argv,pcVar4);
          free(pcVar4);
          if (__s != (char *)0x0) {
            sVar2 = strlen(__s);
            uVar3 = uVar3 + (int)sVar2;
            if (new_size < uVar3) {
              new_size = new_size + (int)sVar2;
              local_48 = apprun_string_extend(local_48,new_size);
            }
            strcat(local_48,__s);
            free(__s);
          }
        }
        str = pcVar1;
      } while (*pcVar1 != '\0');
    }
  }
  return local_48;
}

Assistant:

char *apprun_shell_expand_variables(char const *str, char **argv) {
    if (str == NULL)
        return NULL;

    unsigned buffer_capacity = 1;
    unsigned buffer_len = 0;
    char *buffer = calloc(buffer_capacity, sizeof(char *));

    char const *itr = str;

    while (*itr != '\0') {
        char const *var_start = apprun_shell_find_var_start(itr);
        char const *var_end = apprun_shell_find_var_end(var_start);


        if (var_start > itr) {
            unsigned section_len = var_start - itr;
            if (buffer_len + section_len > buffer_capacity) {
                buffer_capacity = buffer_capacity + section_len;
                buffer = apprun_string_extend(buffer, buffer_capacity);
            }

            strncat(buffer, itr, section_len);
            buffer_len += section_len;
        }


        if (var_start != var_end) {
            char *var_name = apprun_shell_extract_var_name(var_start);
            char *var_value = apprun_shell_resolve_var_value(argv, var_name);

            free(var_name);

            if (var_value) {
                unsigned section_len = strlen(var_value);
                if (buffer_len + section_len > buffer_capacity) {
                    buffer_capacity = buffer_capacity + section_len;
                    buffer = apprun_string_extend(buffer, buffer_capacity);
                }

                strcat(buffer, var_value);
                buffer_len += section_len;
                free(var_value);
            }
        }

        itr = var_end;
    }


    return buffer;
}